

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * CTcPrsOpUnary::parse_inherited(void)

{
  _func_int **pp_Var1;
  bool bVar2;
  CTcTokenizer *this;
  tc_toktyp_t tVar3;
  CTcPrsMem *this_00;
  CTcPrsNode *pCVar4;
  int errnum;
  CTcPrsMem **lhs;
  
  tVar3 = CTcTokenizer::next(G_tok);
  lhs = &G_prsmem;
  if (tVar3 == TOKT_LT) {
    this_00 = (CTcPrsMem *)CTcPrsMem::alloc(G_prsmem,0x18);
    this_00->head_ = (tcprsmem_blk_t *)0x0;
    this_00->tail_ = (tcprsmem_blk_t *)0x0;
    *(int *)&this_00->free_ptr_ = 0;
    CTcTokenizer::next(G_tok);
    bVar2 = false;
    do {
      this = G_tok;
      tVar3 = (G_tok->curtok_).typ_;
      if (0x1f < (int)tVar3) {
        if ((int)tVar3 < 0x2a) {
          if (tVar3 == TOKT_TIMES) {
            CTcFormalTypeList::add_untyped_param((CTcFormalTypeList *)this_00);
            goto LAB_00201239;
          }
          if (tVar3 == TOKT_GT) goto LAB_0020128a;
        }
        else {
          if (tVar3 == TOKT_ELLIPSIS) {
            *(int *)&this_00->free_ptr_ = 1;
            tVar3 = CTcTokenizer::next(this);
            if (tVar3 != TOKT_GT) goto LAB_00201225;
LAB_0020128a:
            CTcTokenizer::next(G_tok);
            goto LAB_0020128f;
          }
          if (tVar3 == TOKT_SEM) goto LAB_00201329;
        }
LAB_0020133d:
        CTcTokenizer::log_error_curtok(G_tok,0x2bcb);
        CTcParser::skip_to_sem();
LAB_0020134f:
        bVar2 = false;
        goto LAB_00201351;
      }
      if ((int)tVar3 < 0x13) {
        if (tVar3 != TOKT_SYM) {
          if (tVar3 != TOKT_EOF) goto LAB_0020133d;
LAB_00201329:
          CTcTokenizer::log_error_curtok(G_tok,0x2bcb);
          goto LAB_0020134f;
        }
        CTcFormalTypeList::add_typed_param((CTcFormalTypeList *)this_00,&G_tok->curtok_);
LAB_00201239:
        tVar3 = CTcTokenizer::next(G_tok);
        if ((int)tVar3 < 0x20) {
          if (tVar3 != TOKT_SYM) {
            if (tVar3 != TOKT_COMMA) {
LAB_00201261:
              errnum = 0x2bcc;
              goto LAB_00201269;
            }
            goto LAB_0020126e;
          }
        }
        else if (tVar3 != TOKT_TIMES) {
          if (tVar3 == TOKT_GT) goto LAB_0020128a;
          if (tVar3 != TOKT_ELLIPSIS) goto LAB_00201261;
        }
        CTcTokenizer::log_error_curtok(G_tok,0x2bcc);
      }
      else if (tVar3 == TOKT_LPAR) {
LAB_00201225:
        CTcTokenizer::log_error_curtok(G_tok,0x2bcd);
LAB_0020128f:
        bVar2 = true;
      }
      else {
        if (tVar3 != TOKT_COMMA) {
          if (tVar3 == TOKT_RPAR) goto LAB_00201329;
          goto LAB_0020133d;
        }
        errnum = 0x2bcb;
LAB_00201269:
        CTcTokenizer::log_error_curtok(G_tok,errnum);
LAB_0020126e:
        CTcTokenizer::next(G_tok);
      }
    } while (!bVar2);
    lhs = (CTcPrsMem **)CTcPrsMem::alloc(G_prsmem,0x10);
    (((CTcPrsNode *)lhs)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    ((CTcPrsNode *)lhs)[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    (((CTcPrsNode *)lhs)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00321cd8;
    ((CTcPrsNode *)lhs)[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this_00;
    bVar2 = true;
    if ((G_tok->curtok_).typ_ != TOKT_LPAR) {
      CTcTokenizer::log_error_curtok(G_tok,0x2bce);
      CTcParser::skip_to_sem();
      bVar2 = false;
    }
LAB_00201351:
    if (!bVar2) {
      return (CTcPrsNode *)0x0;
    }
  }
  else if (tVar3 == TOKT_SYM) {
    lhs = (CTcPrsMem **)CTcPrsMem::alloc(G_prsmem,0x18);
    pp_Var1 = (_func_int **)(G_tok->curtok_).text_len_;
    ((CTcPrsNode *)lhs)[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)(G_tok->curtok_).text_;
    ((CTcPrsNode *)lhs)[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
    (((CTcPrsNode *)lhs)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_0031c5a8;
    G_prs->full_method_ctx_referenced_ = 1;
    CTcTokenizer::next(G_tok);
  }
  else {
    lhs = (CTcPrsMem **)CTcPrsMem::alloc(G_prsmem,0x10);
    (((CTcPrsNode *)lhs)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    ((CTcPrsNode *)lhs)[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    ((CTcPrsNode *)lhs)[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    (((CTcPrsNode *)lhs)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00321cd8;
    G_prs->full_method_ctx_referenced_ = 1;
  }
  pCVar4 = parse_member((CTcPrsNode *)lhs);
  return pCVar4;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_inherited()
{
    CTcPrsNode *lhs;
    
    /* skip the "inherited" keyword and check what follows */
    switch(G_tok->next())
    {
    case TOKT_SYM:
        /* 
         *   it's an "inherited superclass..." expression - set up the
         *   "inherited superclass" node 
         */
        lhs = new CTPNInhClass(G_tok->getcur()->get_text(),
                               G_tok->getcur()->get_text_len());

        /* this passes method context information to the inheritor */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* skip the superclass token */
        G_tok->next();

        /* parse the member expression portion normally */
        break;

    case TOKT_LT:
        /* 
         *   '<' - this is the start of a multi-method type list.  Parse the
         *   list: type1 ',' type2 ',' ... '>', then the argument list to the
         *   'inherited' call.  
         */
        {
            /* create the formal type list */
            CTcFormalTypeList *tl = new (G_prsmem)CTcFormalTypeList();

            /* skip the '<' */
            G_tok->next();

            /* parse each list element */
            for (int done = FALSE ; !done ; )
            {
                switch (G_tok->cur())
                {
                case TOKT_GT:
                    /* end of the list - skip the '>', and we're done */
                    G_tok->next();
                    done = TRUE;
                    break;

                case TOKT_ELLIPSIS:
                    /* '...' */
                    tl->add_ellipsis();

                    /* this has to be the end of the list */
                    if (G_tok->next() == TOKT_GT)
                        G_tok->next();
                    else
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);

                    /* assume the list ends here in any case */
                    done = TRUE;
                    break;

                case TOKT_SYM:
                    /* a type token - add it to the list */
                    tl->add_typed_param(G_tok->getcur());

                finish_type:
                    /* skip the type token */
                    switch (G_tok->next())
                    {
                    case TOKT_COMMA:
                        /* another type follows */
                        G_tok->next();
                        break;

                    case TOKT_GT:
                        G_tok->next();
                        done = TRUE;
                        break;

                    case TOKT_SYM:
                    case TOKT_ELLIPSIS:
                    case TOKT_TIMES:
                        /* probably just a missing comma */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        break;

                    default:
                        /* anything else is an error */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        G_tok->next();
                        break;
                    }
                    break;

                case TOKT_TIMES:
                    /* '*' indicates an untyped parameter */
                    tl->add_untyped_param();
                    goto finish_type;

                case TOKT_LPAR:
                    /* probably a missing '>' */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);
                    done = TRUE;
                    break;

                case TOKT_COMMA:
                    /* probably a missing type */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_tok->next();
                    break;

                case TOKT_SEM:
                case TOKT_RPAR:
                case TOKT_EOF:
                    /* all of these indicate a premature end of the list */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    return 0;

                default:
                    /* anything else is an error */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_prs->skip_to_sem();
                    return 0;
                }
            }

            /* the left-hand side is an "inherited" node, with the arg list */
            lhs = new CTPNInh();
            ((CTPNInh *)lhs)->set_typelist(tl);

            /* an inherited<> expression must have an argument list */
            if (G_tok->cur() != TOKT_LPAR)
            {
                G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_LIST);
                G_prs->skip_to_sem();
                return 0;
            }
        }
        break;
        
    default:
        /*
         *   There's no explicit superclass name listed, so the left-hand
         *   side of the '.' expression is the simple "inherited" node. 
         */
        lhs = new CTPNInh();

        /*
         *   Since we don't have an explicit superclass, we'll need the
         *   method context at run-time to establish the next class in
         *   inheritance order.  Flag the need for the full method context.  
         */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* parse the member expression portion normally */
        break;
    }

    /* parse and return the member expression */
    return parse_member(lhs);
}